

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,io_context *io_context,uint16_t portNum,int nominalBufferSize)

{
  _Atomic_word *p_Var1;
  int iVar2;
  SocketFactory local_28;
  
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.encrypted = false;
  local_28.handshake_server = false;
  local_28._18_6_ = 0;
  TcpServer(this,&local_28,io_context,portNum,nominalBufferSize);
  if (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
      super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
               super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
       super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
         super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TcpServer::TcpServer(
    asio::io_context& io_context,
    uint16_t portNum,
    int nominalBufferSize) :
    TcpServer::TcpServer(
        SocketFactory(),
        io_context,
        portNum,
        nominalBufferSize)
{
}